

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O0

bool compareTwoLibrary(library *a,library *b)

{
  library *b_local;
  library *a_local;
  
  if (a->noOfBooks < b->noOfBooks) {
    if (b->signupProcess < a->signupProcess) {
      if (a->shipTime < b->shipTime) {
        a_local._7_1_ = true;
      }
      else {
        a_local._7_1_ = false;
      }
    }
    else if (b->shipTime < a->shipTime) {
      a_local._7_1_ = true;
    }
    else {
      a_local._7_1_ = false;
    }
  }
  else if (b->signupProcess < a->signupProcess) {
    if (a->shipTime < b->shipTime) {
      a_local._7_1_ = true;
    }
    else {
      a_local._7_1_ = false;
    }
  }
  else if (b->shipTime < a->shipTime) {
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool compareTwoLibrary(library a, library b)
{
    // If total marks are not same then
    // returns true for higher total
    if (a.noOfBooks < b.noOfBooks )
    {
        if (a.signupProcess > b.signupProcess)
        {
            if(a.shipTime < b.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if(b.shipTime < a.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
    }
    else
    {
        if (a.signupProcess > b.signupProcess)
        {
            if(a.shipTime < b.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if(b.shipTime < a.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
    }
}